

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O0

void scp::_scp::cooleyTukey<std::complex<double>>
               (complex<double> *beg,uint64_t stride,complex<double> *base,uint64_t baseStride,
               uint64_t size,pair<unsigned_long,_unsigned_long> *factors,uint64_t factorCount)

{
  ulong __n;
  undefined8 uVar1;
  uint64_t uVar2;
  _Bit_pointer size_00;
  bool bVar3;
  reference pvVar4;
  reference rVar5;
  complex<double> local_180;
  size_type local_170;
  uint64_t k;
  uint64_t j_1;
  uint64_t coeff;
  uint64_t j;
  uint64_t i_1;
  complex<double> *it;
  undefined1 local_138 [8];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> tmp;
  uint64_t rangeOffset;
  uint64_t realSize;
  uint64_t i;
  _Bit_type local_100;
  reference local_f8;
  undefined8 uStack_e8;
  complex<double> tmp_1;
  reference local_d0;
  size_type local_c0;
  uint64_t next;
  uint64_t preced;
  uint64_t n;
  _Bit_type local_a0;
  reference local_98 [2];
  allocator<bool> local_72;
  bool local_71;
  undefined1 local_70 [8];
  vector<bool,_std::allocator<bool>_> visited;
  uint64_t subSize;
  uint64_t radix;
  pair<unsigned_long,_unsigned_long> *factors_local;
  uint64_t size_local;
  uint64_t baseStride_local;
  complex<double> *base_local;
  uint64_t stride_local;
  complex<double> *beg_local;
  
  if (size != 1) {
    __n = factors->first;
    factors->second = factors->second - 1;
    radix = (uint64_t)factors;
    if (factors->second == 0) {
      radix = (uint64_t)(factors + 1);
      factorCount = factorCount - 1;
    }
    visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)(size / __n);
    local_71 = false;
    std::allocator<bool>::allocator(&local_72);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_70,size,&local_71,&local_72);
    std::allocator<bool>::~allocator(&local_72);
    local_98[0] = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)local_70,0);
    std::_Bit_reference::operator=(local_98,true);
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_70,size - 1);
    local_a0 = rVar5._M_mask;
    n = (uint64_t)rVar5._M_p;
    std::_Bit_reference::operator=((_Bit_reference *)&n,true);
    preced = 0;
    while (size_00 = visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage, preced != size) {
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_70,preced);
      local_d0 = rVar5;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_d0);
      if (bVar3) {
        preced = preced + 1;
      }
      else {
        uStack_e8 = *(undefined8 *)beg[preced * stride]._M_value;
        tmp_1._M_value._0_8_ = *(undefined8 *)(beg[preced * stride]._M_value + 8);
        rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_70,preced);
        local_f8 = rVar5;
        std::_Bit_reference::operator=(&local_f8,true);
        next = preced;
        for (local_c0 = preced / (ulong)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                        super__Bvector_impl_data._M_end_of_storage +
                        (preced % (ulong)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_end_of_storage) * __n;
            local_c0 != preced;
            local_c0 = local_c0 /
                       (ulong)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage +
                       (local_c0 %
                       (ulong)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage) * __n) {
          uVar1 = *(undefined8 *)(beg[local_c0 * stride]._M_value + 8);
          *(undefined8 *)beg[next * stride]._M_value =
               *(undefined8 *)beg[local_c0 * stride]._M_value;
          *(undefined8 *)(beg[next * stride]._M_value + 8) = uVar1;
          rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)local_70,local_c0);
          local_100 = rVar5._M_mask;
          i = (uint64_t)rVar5._M_p;
          std::_Bit_reference::operator=((_Bit_reference *)&i,true);
          next = local_c0;
        }
        *(undefined8 *)beg[next * stride]._M_value = uStack_e8;
        *(undefined8 *)(beg[next * stride]._M_value + 8) = tmp_1._M_value._0_8_;
      }
    }
    for (realSize = 0; realSize < __n; realSize = realSize + 1) {
      cooleyTukey<std::complex<double>>
                (beg + realSize * (long)size_00 * stride,stride,base,__n * baseStride,
                 (uint64_t)size_00,(pair<unsigned_long,_unsigned_long> *)radix,factorCount);
    }
    if (*(ulong *)radix != __n) {
      radix = radix - 0x10;
    }
    *(long *)(radix + 8) = *(long *)(radix + 8) + 1;
    tmp.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)((long)size_00 * stride);
    std::allocator<std::complex<double>_>::allocator
              ((allocator<std::complex<double>_> *)((long)&it + 7));
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_138,__n
               ,(allocator<std::complex<double>_> *)((long)&it + 7));
    std::allocator<std::complex<double>_>::~allocator
              ((allocator<std::complex<double>_> *)((long)&it + 7));
    i_1 = (uint64_t)beg;
    for (j = 0; j < size_00; j = j + 1) {
      for (coeff = 0; uVar2 = i_1, coeff < __n; coeff = coeff + 1) {
        pvVar4 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                 operator[]((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                            local_138,coeff);
        *(undefined8 *)pvVar4->_M_value = *(undefined8 *)uVar2;
        *(undefined8 *)(pvVar4->_M_value + 8) = *(undefined8 *)(uVar2 + 8);
        i_1 = (long)tmp.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x10 + i_1;
      }
      i_1 = i_1 + __n * (long)tmp.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage * -0x10;
      j_1 = j;
      for (k = 0; k < __n; k = k + 1) {
        std::complex<double>::operator=((complex<double> *)i_1,0.0);
        for (local_170 = 0; local_170 < __n; local_170 = local_170 + 1) {
          pvVar4 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                   operator[]((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_138,local_170);
          std::operator*(pvVar4,base + ((local_170 * j_1) % ((long)size_00 * __n)) *
                                       ((__n * baseStride) / __n));
          std::complex<double>::operator+=((complex<double> *)i_1,&local_180);
        }
        i_1 = (long)tmp.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x10 + i_1;
        j_1 = (long)size_00 + j_1;
      }
      i_1 = stride * 0x10 +
            i_1 + __n * (long)tmp.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage * -0x10;
    }
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_138);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_70);
  }
  return;
}

Assistant:

constexpr void cooleyTukey(TValue* beg, uint64_t stride, const TValue* base, uint64_t baseStride, uint64_t size, std::pair<uint64_t, uint64_t>* factors, uint64_t factorCount)
		{
			if (size == 1)
			{
				return;
			}

			// TODO: https://en.wikipedia.org/wiki/Rader%27s_FFT_algorithm
			// if (factorCount == 1 && factors->second == 1)
			// {
			// }

			// Compute best radix and remove it from factors

			const uint64_t radix = factors->first;

			--factors->second;
			if (factors->second == 0)
			{
				++factors;
				--factorCount;
			}

			// Re-order elements according to radix

			const uint64_t subSize = size / radix;

			std::vector<bool> visited(size, false);
			visited[0] = true;
			visited[size - 1] = true;

			uint64_t n = 0;
			uint64_t preced, next;
			while (n != size)
			{
				if (visited[n])
				{
					++n;
					continue;
				}

				TValue tmp = *(beg + n * stride);
				visited[n] = true;

				preced = n;
				next = preced / subSize + (preced % subSize) * radix;

				while (next != n)
				{
					*(beg + preced * stride) = *(beg + next * stride);
					visited[next] = true;

					preced = next;
					next = preced / subSize + (preced % subSize) * radix;
				}

				*(beg + preced * stride) = tmp;
			}

			// Run algorithm on sub-ranges

			size = subSize;
			baseStride *= radix;

			for (uint64_t i = 0; i < radix; ++i)
			{
				cooleyTukey(beg + i * size * stride, stride, base, baseStride, size, factors, factorCount);
			}

			baseStride /= radix;
			const uint64_t realSize = size * radix;

			// Put back the factor

			if (factors->first != radix)
			{
				--factors;
				++factorCount;
			}
			++factors->second;

			// Merge sub-ranges

			const uint64_t rangeOffset = size * stride;
				
			std::vector<TValue> tmp(radix);
			TValue* it = beg;
			for (uint64_t i = 0; i < size; ++i, it += stride)
			{
				for (uint64_t j = 0; j < radix; ++j, it += rangeOffset)
				{
					tmp[j] = *it;
				}
				it -= radix * rangeOffset;

				uint64_t coeff = i;
				for (uint64_t j = 0; j < radix; ++j, it += rangeOffset, coeff += size)
				{
					*it = 0;
					for (uint64_t k = 0; k < radix; ++k)
					{
						*it += tmp[k] * *(base + ((k * coeff) % realSize) * baseStride);
					}
				}
				it -= radix * rangeOffset;
			}
		}